

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl_fileutils.c
# Opt level: O0

void mcu8str_assign(mcu8str *dest,mcu8str *src)

{
  mcu8str *in_RSI;
  mcu8str *in_RDI;
  mcu8str newstr;
  mcu8str *in_stack_ffffffffffffffe0;
  mcu8str *in_stack_ffffffffffffffe8;
  
  if (in_RDI->buflen < in_RSI->size + 1) {
    mcu8str_create((mcu8str_size_t)in_RSI);
    mcu8str_assign(in_RSI,in_stack_ffffffffffffffe8);
    mcu8str_swap(in_RDI,(mcu8str *)&stack0xffffffffffffffd8);
    mcu8str_dealloc(in_stack_ffffffffffffffe0);
  }
  else {
    memmove(in_RDI->c_str,in_RSI->c_str,(ulong)(in_RSI->size + 1));
    in_RDI->size = in_RSI->size;
  }
  return;
}

Assistant:

void mcu8str_assign( mcu8str* dest, const mcu8str* src )
  {
    if ( src->size +1 <= dest->buflen ) {
      //Already fits. Using memmove in case of self assignment:
      STDNS memmove( dest->c_str, src->c_str, src->size + 1 );
      dest->size = src->size;
      return;
    }
    mcu8str newstr = mcu8str_create( src->size );
    mcu8str_assign( &newstr, src );
    mcu8str_swap( dest, &newstr );
    mcu8str_dealloc( &newstr );
  }